

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f *wo,Float g,Point2f *u,Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar15 [64];
  uint uVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  Vector3f VVar20;
  
  auVar15._4_60_ = in_register_00001204;
  auVar15._0_4_ = g;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar13 = auVar15._0_16_;
  auVar9 = vandps_avx512vl(auVar13,auVar9);
  if (0.001 <= auVar9._0_4_) {
    auVar9 = vfnmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(g + 1.0)),ZEXT416((uint)(g + g)),
                               ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x));
    auVar17._0_4_ = auVar9._0_4_ / auVar10._0_4_;
    auVar17._4_12_ = auVar9._4_12_;
    auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
    auVar9 = vfnmadd231ss_fma(auVar9,auVar17,auVar17);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(auVar9,auVar6);
    auVar10._0_4_ = auVar9._0_4_ / (g + g);
    auVar10._4_12_ = auVar9._4_12_;
  }
  else {
    auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                              ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x),
                              ZEXT416(0x3f800000));
  }
  uVar16 = auVar10._0_4_;
  auVar9 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar10,auVar10);
  auVar9 = vmaxss_avx(auVar9,ZEXT816(0) << 0x40);
  if (auVar9._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar9._0_4_);
  }
  else {
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar7 = auVar9._0_4_;
  }
  fVar12 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar3 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar11 = cosf(fVar12);
  fVar12 = sinf(fVar12);
  if (pdf != (Float *)0x0) {
    auVar9 = vfmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)(g + g)),ZEXT416(uVar16),auVar9);
    auVar13 = vfnmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar9 = vmaxss_avx(auVar10,ZEXT816(0) << 0x20);
    if (auVar9._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar9 = vsqrtss_avx(auVar9,auVar9);
      fVar8 = auVar9._0_4_;
    }
    *pdf = (auVar13._0_4_ * 0.07957747) / (auVar10._0_4_ * fVar8);
  }
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  auVar9 = vminss_avx(auVar14,ZEXT416((uint)fVar7));
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar7),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar7 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar9._0_4_);
  fVar11 = fVar7 * fVar11;
  auVar13._8_4_ = 0x80000000;
  auVar13._0_8_ = 0x8000000080000000;
  auVar13._12_4_ = 0x80000000;
  auVar10 = vpternlogd_avx512vl(auVar14,ZEXT416((uint)fVar1),auVar13,0xf8);
  fVar18 = auVar10._0_4_;
  fVar19 = -1.0 / (fVar1 + fVar18);
  auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 * fVar18)),ZEXT416((uint)fVar19),auVar14);
  fVar12 = fVar12 * fVar7;
  fVar7 = fVar2 * fVar3 * fVar19;
  auVar9 = vminss_avx(auVar14,ZEXT416(uVar16));
  uVar4 = vcmpss_avx512f(ZEXT416(uVar16),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar8 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar9._0_4_);
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar19),auVar10);
  auVar9 = vinsertps_avx(ZEXT416((uint)(fVar8 * fVar2 + fVar7 * fVar12 + fVar11 * auVar13._0_4_)),
                         ZEXT416((uint)(fVar8 * fVar3 +
                                       fVar11 * fVar7 * fVar18 + auVar9._0_4_ * fVar12)),0x10);
  VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar9._0_8_;
  VVar20.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar8 * fVar1 + (fVar2 * -fVar18 * fVar11 - fVar3 * fVar12);
  return (Vector3f)VVar20.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f SampleHenyeyGreenstein(const Vector3f &wo, Float g, const Point2f &u,
                                Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}